

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanCommandBuffer::DispatchIndirect
          (VulkanCommandBuffer *this,VkBuffer Buffer,VkDeviceSize Offset)

{
  bool bVar1;
  Char *pCVar2;
  char (*in_RCX) [32];
  undefined1 local_90 [8];
  string msg_2;
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  VkDeviceSize Offset_local;
  VkBuffer Buffer_local;
  VulkanCommandBuffer *this_local;
  
  msg.field_2._8_8_ = Offset;
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",in_RCX);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar2,"DispatchIndirect",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x117);
    std::__cxx11::string::~string((string *)local_40);
  }
  bVar1 = IsInRenderScope(this);
  if (bVar1) {
    Diligent::FormatString<char[168]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [168])
               "vkCmdDispatchIndirect() must be called outside of render pass (https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdDispatchIndirect-renderpass)"
              );
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar2,"DispatchIndirect",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x11a);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if ((this->m_State).ComputePipeline == (VkPipeline)0x0) {
    Diligent::FormatString<char[26]>((string *)local_90,(char (*) [26])"No compute pipeline bound");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar2,"DispatchIndirect",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x11b);
    std::__cxx11::string::~string((string *)local_90);
  }
  FlushBarriers(this);
  (*vkCmdDispatchIndirect)(this->m_VkCmdBuffer,Buffer,msg.field_2._8_8_);
  return;
}

Assistant:

__forceinline void DispatchIndirect(VkBuffer Buffer, VkDeviceSize Offset)
    {
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        VERIFY(!IsInRenderScope(),
               "vkCmdDispatchIndirect() must be called outside of render pass "
               "(https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdDispatchIndirect-renderpass)");
        VERIFY(m_State.ComputePipeline != VK_NULL_HANDLE, "No compute pipeline bound");

        FlushBarriers();
        vkCmdDispatchIndirect(m_VkCmdBuffer, Buffer, Offset);
    }